

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTcSymLocal::gen_code_member
          (CTcSymLocal *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs
          ,CTcNamedArgs *named_args)

{
  int varargs_00;
  
  (*(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry._vptr_CVmHashEntry[0x18])(this,0);
  varargs_00 = 0;
  if (varargs != 0) {
    CTcGenTarg::write_op(G_cg,0x8d);
    varargs_00 = varargs;
  }
  CTcPrsNode::s_gen_member_rhs(discard,prop_expr,prop_is_expr,argc,varargs_00,named_args);
  return;
}

Assistant:

void CTcSymLocal::gen_code_member(
    int discard, CTcPrsNode *prop_expr, int prop_is_expr,
    int argc, int varargs, CTcNamedArgs *named_args)
{
    /* generate code to evaluate the local */
    gen_code(FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* use the standard member generation */
    CTcPrsNode::s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                                 argc, varargs, named_args);
}